

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O1

void duckdb::
     TemplatedWritePlain<duckdb::string_t,duckdb::string_t,duckdb::ParquetBlobOperator,false>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  unsigned_long *puVar1;
  char *pcVar2;
  long *plVar3;
  string_t target_value;
  StringStatisticsState *string_stats;
  undefined8 local_58;
  char *local_50;
  StringStatisticsState *local_48;
  anon_union_16_2_67f50693_for_value local_40;
  
  if (chunk_start < chunk_end) {
    plVar3 = (long *)(col->data + chunk_start * 0x10 + 8);
    local_48 = (StringStatisticsState *)stats;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((puVar1 == (unsigned_long *)0x0) ||
         ((puVar1[chunk_start >> 6] >> (chunk_start & 0x3f) & 1) != 0)) {
        local_58 = plVar3[-1];
        local_50 = (char *)*plVar3;
        local_40._0_8_ = local_58;
        local_40.pointer.ptr = local_50;
        StringStatisticsState::Update(local_48,(string_t *)&local_40.pointer);
        local_40.pointer.length = (undefined4)local_58;
        (**ser->_vptr_WriteStream)(ser,&local_40,4);
        pcVar2 = (char *)((long)&local_58 + 4);
        if (0xc < (local_58 & 0xffffffff)) {
          pcVar2 = local_50;
        }
        (**ser->_vptr_WriteStream)(ser,pcVar2);
      }
      chunk_start = chunk_start + 1;
      plVar3 = plVar3 + 2;
    } while (chunk_end != chunk_start);
  }
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}